

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffoptplt(fitsfile *fptr,char *tempname,int *status)

{
  int iVar1;
  char local_98 [8];
  char card [81];
  int local_3c;
  int ii;
  int nadd;
  int nkeys;
  int tstatus;
  fitsfile *tptr;
  int *status_local;
  char *tempname_local;
  fitsfile *fptr_local;
  
  nadd = 0;
  if (*status < 1) {
    if ((tempname == (char *)0x0) || (*tempname == '\0')) {
      fptr_local._4_4_ = *status;
    }
    else {
      tptr = (fitsfile *)status;
      status_local = (int *)tempname;
      tempname_local = (char *)fptr;
      ffopen((fitsfile **)&nkeys,tempname,0,&nadd);
      if (nadd == 0) {
        ffmahd(_nkeys,1,(int *)0x0,&tptr->HDUposition);
        while (tptr->HDUposition < 1) {
          ffghsp(_nkeys,&ii,&local_3c,&tptr->HDUposition);
          for (stack0xffffffffffffffc0 = 1; stack0xffffffffffffffc0 <= ii;
              register0x00000000 = stack0xffffffffffffffc0 + 1) {
            ffgrec(_nkeys,stack0xffffffffffffffc0,local_98,&tptr->HDUposition);
            iVar1 = strncmp(local_98,"PCOUNT  ",8);
            if ((iVar1 == 0) && (iVar1 = strncmp(card + 0x11,"    0",5), iVar1 != 0)) {
              strncpy(local_98,"PCOUNT  =                    0",0x1e);
            }
            ffprec((fitsfile *)tempname_local,local_98,&tptr->HDUposition);
          }
          ffmrhd(_nkeys,1,(int *)0x0,&tptr->HDUposition);
          ffcrhd((fitsfile *)tempname_local,&tptr->HDUposition);
        }
        if (tptr->HDUposition == 0x6b) {
          tptr->HDUposition = 0;
        }
        ffclos(_nkeys,&tptr->HDUposition);
        ffmahd((fitsfile *)tempname_local,1,(int *)0x0,&tptr->HDUposition);
        fptr_local._4_4_ = tptr->HDUposition;
      }
      else {
        ffxmsg(2,local_98);
        fits_execute_template((fitsfile *)tempname_local,(char *)status_local,&tptr->HDUposition);
        ffmahd((fitsfile *)tempname_local,1,(int *)0x0,&tptr->HDUposition);
        fptr_local._4_4_ = tptr->HDUposition;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffoptplt(fitsfile *fptr,      /* O - FITS file pointer                   */
            const char *tempname, /* I - name of template file               */
            int *status)          /* IO - error status                       */
/*
  open template file and use it to create new file
*/
{
    fitsfile *tptr;
    int tstatus = 0, nkeys, nadd, ii;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (tempname == NULL || *tempname == '\0')     /* no template file? */
        return(*status);

    /* try opening template */
    ffopen(&tptr, (char *) tempname, READONLY, &tstatus); 

    if (tstatus)  /* not a FITS file, so treat it as an ASCII template */
    {
        ffxmsg(2, card);  /* clear the  error message */
        fits_execute_template(fptr, (char *) tempname, status);

        ffmahd(fptr, 1, 0, status);   /* move back to the primary array */
        return(*status);
    }
    else  /* template is a valid FITS file */
    {
        ffmahd(tptr, 1, NULL, status); /* make sure we are at the beginning */
        while (*status <= 0)
        {
           ffghsp(tptr, &nkeys, &nadd, status); /* get no. of keywords */

           for (ii = 1; ii <= nkeys; ii++)   /* copy keywords */
           {
              ffgrec(tptr,  ii, card, status);

              /* must reset the PCOUNT keyword to zero in the new output file */
              if (strncmp(card, "PCOUNT  ",8) == 0) { /* the PCOUNT keyword? */
	         if (strncmp(card+25, "    0", 5)) {  /* non-zero value? */
		    strncpy(card, "PCOUNT  =                    0", 30);
		 }
	      }   
 
              ffprec(fptr, card, status);
           }

           ffmrhd(tptr, 1, 0, status); /* move to next HDU until error */
           ffcrhd(fptr, status);  /* create empty new HDU in output file */
        }

        if (*status == END_OF_FILE)
        {
           *status = 0;              /* expected error condition */
        }
        ffclos(tptr, status);       /* close the template file */
    }

    ffmahd(fptr, 1, 0, status);   /* move to the primary array */
    return(*status);
}